

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O3

void Mvc_CoverArray2List(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t **ppMVar1;
  Mvc_Cube_t *pMVar2;
  int iVar3;
  ulong uVar4;
  Mvc_Cube_t *pMVar5;
  
  if (pCover->pCubes != (Mvc_Cube_t **)0x0) {
    iVar3 = Mvc_CoverReadCubeNum(pCover);
    if (iVar3 != 0) {
      if (iVar3 == 1) {
        pMVar5 = *pCover->pCubes;
        pMVar5->pNext = (Mvc_Cube_t *)0x0;
        (pCover->lCubes).pTail = pMVar5;
        (pCover->lCubes).pHead = pMVar5;
      }
      else {
        ppMVar1 = pCover->pCubes;
        (pCover->lCubes).pHead = *ppMVar1;
        pMVar5 = ppMVar1[(long)iVar3 + -1];
        pMVar5->pNext = (Mvc_Cube_t *)0x0;
        (pCover->lCubes).pTail = pMVar5;
        if (1 < iVar3) {
          uVar4 = 0;
          pMVar5 = *ppMVar1;
          do {
            pMVar2 = ppMVar1[uVar4 + 1];
            uVar4 = uVar4 + 1;
            pMVar5->pNext = pMVar2;
            pMVar5 = pMVar2;
          } while (iVar3 - 1 != uVar4);
        }
      }
    }
    return;
  }
  __assert_fail("pCover->pCubes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/mvc/mvcList.c"
                ,0x13b,"void Mvc_CoverArray2List(Mvc_Cover_t *)");
}

Assistant:

void Mvc_CoverArray2List( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int nCubes, i;

    assert( pCover->pCubes );

    nCubes = Mvc_CoverReadCubeNum(pCover);
    if ( nCubes == 0 )
        return;
    if ( nCubes == 1 )
    {
        pCube    = pCover->pCubes[0];
        pCube->pNext = NULL;
        pCover->lCubes.pHead = pCover->lCubes.pTail = pCube;
        return;
    }
    // set up the first cube
    pCube = pCover->pCubes[0];
    pCover->lCubes.pHead = pCube;
    // set up the last cube
    pCube = pCover->pCubes[nCubes-1];
    pCube->pNext = NULL;
    pCover->lCubes.pTail = pCube;

    // link all cubes starting from the first one
    for ( i = 0; i < nCubes - 1; i++ )
        pCover->pCubes[i]->pNext = pCover->pCubes[i+1];
}